

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O3

void ggml_quantize_mat_t<8l,(ggml_type)8>(float *x,void *vy,int64_t nrow,int64_t n_per_row)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [32];
  undefined1 (*pauVar13) [32];
  long lVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  float fVar21;
  undefined1 in_ZMM11 [64];
  __m256 idvec [4];
  __m256 srcv [4] [4];
  float local_2c0 [7];
  uint uStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float afStack_240 [8];
  undefined1 auStack_220 [32];
  undefined1 auStack_200 [32];
  undefined1 auStack_1e0 [32];
  float afStack_1c0 [110];
  undefined1 auVar22 [64];
  
  lVar14 = n_per_row + 0x1f;
  if (-1 < n_per_row) {
    lVar14 = n_per_row;
  }
  uVar10 = (uint)(lVar14 >> 5);
  if (0 < (int)uVar10) {
    auVar15._8_4_ = 0x7fffffff;
    auVar15._0_8_ = 0x7fffffff7fffffff;
    auVar15._12_4_ = 0x7fffffff;
    auVar15._16_4_ = 0x7fffffff;
    auVar15._20_4_ = 0x7fffffff;
    auVar15._24_4_ = 0x7fffffff;
    auVar15._28_4_ = 0x7fffffff;
    auVar7 = vpmovsxbd_avx2(ZEXT816(0x703060205010400));
    pauVar12 = (undefined1 (*) [32])(x + 0x18);
    uVar11 = 0;
    do {
      lVar14 = 0;
      pauVar13 = pauVar12;
      do {
        pauVar1 = pauVar13 + -3;
        auVar2 = pauVar13[-2];
        auVar3 = pauVar13[-1];
        auVar4 = *pauVar13;
        pauVar13 = (undefined1 (*) [32])(*pauVar13 + n_per_row * 4);
        auVar5 = vandps_avx(*pauVar1,auVar15);
        auVar6 = vandps_avx(auVar2,auVar15);
        *(undefined1 (*) [32])(afStack_240 + lVar14) = *pauVar1;
        *(undefined1 (*) [32])(auStack_220 + lVar14 * 4) = auVar2;
        *(undefined1 (*) [32])(auStack_200 + lVar14 * 4) = auVar3;
        *(undefined1 (*) [32])(auStack_1e0 + lVar14 * 4) = auVar4;
        auVar5 = vmaxps_avx(auVar5,auVar6);
        auVar2 = vandps_avx(auVar3,auVar15);
        auVar3 = vmaxps_avx(auVar5,auVar2);
        auVar2 = vandps_avx(auVar4,auVar15);
        auVar2 = vmaxps_avx(auVar3,auVar2);
        auVar19 = vmaxps_avx(auVar2._16_16_,auVar2._0_16_);
        auVar18 = vshufpd_avx(auVar19,auVar19,3);
        auVar19 = vmaxps_avx(auVar19,auVar18);
        auVar18 = vmovshdup_avx(auVar19);
        auVar19 = vmaxss_avx(auVar19,auVar18);
        auVar18._0_4_ = auVar19._0_4_ / 127.0;
        auVar18._4_12_ = auVar19._4_12_;
        fVar21 = 127.0 / auVar19._0_4_;
        auVar22 = ZEXT464((uint)fVar21);
        uVar8 = vcmpss_avx512f(auVar19,ZEXT816(0) << 0x40,4);
        uVar9 = (uint)((byte)uVar8 & 1) * (int)fVar21;
        auVar16 = ZEXT464(uVar9);
        auVar19 = vcvtps2ph_f16c(auVar18,0);
        auVar20 = ZEXT1664(auVar19);
        vpextrw_avx(auVar19,0);
        *(uint *)((long)local_2c0 + lVar14) = uVar9;
        *(uint *)((long)local_2c0 + lVar14 + 4) = uVar9;
        *(uint *)((long)local_2c0 + lVar14 + 8) = uVar9;
        *(uint *)((long)local_2c0 + lVar14 + 0xc) = uVar9;
        *(uint *)((long)local_2c0 + lVar14 + 0x10) = uVar9;
        *(uint *)((long)local_2c0 + lVar14 + 0x14) = uVar9;
        *(uint *)((long)local_2c0 + lVar14 + 0x18) = uVar9;
        *(uint *)((long)&uStack_2a4 + lVar14) = uVar9;
        lVar14 = lVar14 + 0x20;
      } while (lVar14 != 0x80);
      lVar14 = -0x80;
      do {
        auVar17._0_4_ = local_2c0[0] * *(float *)((long)afStack_1c0 + lVar14);
        auVar17._4_4_ = local_2c0[1] * *(float *)((long)afStack_1c0 + lVar14 + 4);
        auVar17._8_4_ = local_2c0[2] * *(float *)((long)afStack_1c0 + lVar14 + 8);
        auVar17._12_4_ = local_2c0[3] * *(float *)((long)afStack_1c0 + lVar14 + 0xc);
        auVar17._16_4_ = local_2c0[4] * *(float *)((long)afStack_1c0 + lVar14 + 0x10);
        auVar17._20_4_ = local_2c0[5] * *(float *)((long)afStack_1c0 + lVar14 + 0x14);
        auVar17._28_36_ = auVar16._28_36_;
        auVar17._24_4_ = local_2c0[6] * *(float *)((long)afStack_1c0 + lVar14 + 0x18);
        auVar16._0_4_ = local_2a0 * *(float *)((long)afStack_1c0 + lVar14 + 0x80);
        auVar16._4_4_ = fStack_29c * *(float *)((long)afStack_1c0 + lVar14 + 0x84);
        auVar16._8_4_ = fStack_298 * *(float *)((long)afStack_1c0 + lVar14 + 0x88);
        auVar16._12_4_ = fStack_294 * *(float *)((long)afStack_1c0 + lVar14 + 0x8c);
        auVar16._16_4_ = fStack_290 * *(float *)((long)afStack_1c0 + lVar14 + 0x90);
        auVar16._20_4_ = fStack_28c * *(float *)((long)afStack_1c0 + lVar14 + 0x94);
        auVar16._28_36_ = auVar20._28_36_;
        auVar16._24_4_ = fStack_288 * *(float *)((long)afStack_1c0 + lVar14 + 0x98);
        auVar20._0_4_ = local_280 * *(float *)((long)afStack_1c0 + lVar14 + 0x100);
        auVar20._4_4_ = fStack_27c * *(float *)((long)afStack_1c0 + lVar14 + 0x104);
        auVar20._8_4_ = fStack_278 * *(float *)((long)afStack_1c0 + lVar14 + 0x108);
        auVar20._12_4_ = fStack_274 * *(float *)((long)afStack_1c0 + lVar14 + 0x10c);
        auVar20._16_4_ = fStack_270 * *(float *)((long)afStack_1c0 + lVar14 + 0x110);
        auVar20._20_4_ = fStack_26c * *(float *)((long)afStack_1c0 + lVar14 + 0x114);
        auVar20._28_36_ = auVar22._28_36_;
        auVar20._24_4_ = fStack_268 * *(float *)((long)afStack_1c0 + lVar14 + 0x118);
        auVar22._0_4_ = local_260 * *(float *)((long)afStack_1c0 + lVar14 + 0x180);
        auVar22._4_4_ = fStack_25c * *(float *)((long)afStack_1c0 + lVar14 + 0x184);
        auVar22._8_4_ = fStack_258 * *(float *)((long)afStack_1c0 + lVar14 + 0x188);
        auVar22._12_4_ = fStack_254 * *(float *)((long)afStack_1c0 + lVar14 + 0x18c);
        auVar22._16_4_ = fStack_250 * *(float *)((long)afStack_1c0 + lVar14 + 400);
        auVar22._20_4_ = fStack_24c * *(float *)((long)afStack_1c0 + lVar14 + 0x194);
        auVar22._28_36_ = in_ZMM11._28_36_;
        auVar22._24_4_ = fStack_248 * *(float *)((long)afStack_1c0 + lVar14 + 0x198);
        auVar2 = vroundps_avx(auVar17._0_32_,0);
        auVar3 = vroundps_avx(auVar16._0_32_,0);
        auVar4 = vroundps_avx(auVar22._0_32_,0);
        auVar5 = vroundps_avx(auVar20._0_32_,0);
        auVar22 = ZEXT3264(auVar5);
        auVar2 = vcvtps2dq_avx(auVar2);
        auVar3 = vcvtps2dq_avx(auVar3);
        auVar4 = vcvtps2dq_avx(auVar4);
        in_ZMM11 = ZEXT3264(auVar4);
        auVar3 = vpackssdw_avx2(auVar2,auVar3);
        auVar2 = vcvtps2dq_avx(auVar5);
        auVar2 = vpackssdw_avx2(auVar2,auVar4);
        auVar20 = ZEXT3264(auVar2);
        auVar2 = vpacksswb_avx2(auVar3,auVar2);
        auVar2 = vpermd_avx2(auVar7,auVar2);
        auVar16 = ZEXT3264(auVar2);
        *(undefined1 (*) [32])((long)vy + lVar14 + 0x88) = auVar2;
        lVar14 = lVar14 + 0x20;
      } while (lVar14 != 0);
      uVar11 = uVar11 + 1;
      vy = (void *)((long)vy + 0x88);
      pauVar12 = pauVar12 + 4;
    } while (uVar11 != (uVar10 & 0x7fffffff));
  }
  return;
}

Assistant:

static void ggml_quantize_mat_q8_0_4x8(const float * GGML_RESTRICT x, void * GGML_RESTRICT vy, int64_t k) {
    assert(QK8_0 == 32);
    assert(k % QK8_0 == 0);
    const int nb = k / QK8_0;

    block_q8_0x4 * GGML_RESTRICT y = (block_q8_0x4 *) vy;

#if defined(__ARM_NEON)
    float32x4_t srcv[4][8];
    float id[4];

    for (int i = 0; i < nb; i++) {
        float32x4_t asrcv[8];
        float32x4_t amaxv[8];

        for (int row_iter = 0; row_iter < 4; row_iter++) {
            for (int j = 0; j < 8; j++) srcv[row_iter][j] = vld1q_f32(x + row_iter * k + i * 32 + 4 * j);
            for (int j = 0; j < 8; j++) asrcv[j] = vabsq_f32(srcv[row_iter][j]);

            for (int j = 0; j < 4; j++) amaxv[2 * j] = vmaxq_f32(asrcv[2 * j], asrcv[2 * j + 1]);
            for (int j = 0; j < 2; j++) amaxv[4 * j] = vmaxq_f32(amaxv[4 * j], amaxv[4 * j + 2]);
            for (int j = 0; j < 1; j++) amaxv[8 * j] = vmaxq_f32(amaxv[8 * j], amaxv[8 * j + 4]);

            const float amax = vmaxvq_f32(amaxv[0]);

            const float d = amax / ((1 << 7) - 1);
            id[row_iter] = d ? 1.0f / d : 0.0f;

            y[i].d[row_iter] = GGML_FP32_TO_FP16(d);
        }

        for (int j = 0; j < 4; j++) {
            float32x4_t v = vmulq_n_f32(srcv[0][2 * j], id[0]);
            int32x4_t vi = vcvtnq_s32_f32(v);
            y[i].qs[32 * j + 0] = vgetq_lane_s32(vi, 0);
            y[i].qs[32 * j + 1] = vgetq_lane_s32(vi, 1);
            y[i].qs[32 * j + 2] = vgetq_lane_s32(vi, 2);
            y[i].qs[32 * j + 3] = vgetq_lane_s32(vi, 3);
            v = vmulq_n_f32(srcv[0][2 * j + 1], id[0]);
            vi = vcvtnq_s32_f32(v);
            y[i].qs[32 * j + 4] = vgetq_lane_s32(vi, 0);
            y[i].qs[32 * j + 5] = vgetq_lane_s32(vi, 1);
            y[i].qs[32 * j + 6] = vgetq_lane_s32(vi, 2);
            y[i].qs[32 * j + 7] = vgetq_lane_s32(vi, 3);

            v = vmulq_n_f32(srcv[1][2 * j], id[1]);
            vi = vcvtnq_s32_f32(v);
            y[i].qs[32 * j + 8] = vgetq_lane_s32(vi, 0);
            y[i].qs[32 * j + 9] = vgetq_lane_s32(vi, 1);
            y[i].qs[32 * j + 10] = vgetq_lane_s32(vi, 2);
            y[i].qs[32 * j + 11] = vgetq_lane_s32(vi, 3);
            v = vmulq_n_f32(srcv[1][2 * j + 1], id[1]);
            vi = vcvtnq_s32_f32(v);
            y[i].qs[32 * j + 12] = vgetq_lane_s32(vi, 0);
            y[i].qs[32 * j + 13] = vgetq_lane_s32(vi, 1);
            y[i].qs[32 * j + 14] = vgetq_lane_s32(vi, 2);
            y[i].qs[32 * j + 15] = vgetq_lane_s32(vi, 3);

            v = vmulq_n_f32(srcv[2][2 * j], id[2]);
            vi = vcvtnq_s32_f32(v);
            y[i].qs[32 * j + 16] = vgetq_lane_s32(vi, 0);
            y[i].qs[32 * j + 17] = vgetq_lane_s32(vi, 1);
            y[i].qs[32 * j + 18] = vgetq_lane_s32(vi, 2);
            y[i].qs[32 * j + 19] = vgetq_lane_s32(vi, 3);
            v = vmulq_n_f32(srcv[2][2 * j + 1], id[2]);
            vi = vcvtnq_s32_f32(v);
            y[i].qs[32 * j + 20] = vgetq_lane_s32(vi, 0);
            y[i].qs[32 * j + 21] = vgetq_lane_s32(vi, 1);
            y[i].qs[32 * j + 22] = vgetq_lane_s32(vi, 2);
            y[i].qs[32 * j + 23] = vgetq_lane_s32(vi, 3);

            v = vmulq_n_f32(srcv[3][2 * j], id[3]);
            vi = vcvtnq_s32_f32(v);
            y[i].qs[32 * j + 24] = vgetq_lane_s32(vi, 0);
            y[i].qs[32 * j + 25] = vgetq_lane_s32(vi, 1);
            y[i].qs[32 * j + 26] = vgetq_lane_s32(vi, 2);
            y[i].qs[32 * j + 27] = vgetq_lane_s32(vi, 3);
            v = vmulq_n_f32(srcv[3][2 * j + 1], id[3]);
            vi = vcvtnq_s32_f32(v);
            y[i].qs[32 * j + 28] = vgetq_lane_s32(vi, 0);
            y[i].qs[32 * j + 29] = vgetq_lane_s32(vi, 1);
            y[i].qs[32 * j + 30] = vgetq_lane_s32(vi, 2);
            y[i].qs[32 * j + 31] = vgetq_lane_s32(vi, 3);
        }
    }
#elif defined(__AVX2__) || defined(__AVX__)
    float id[4];
    __m256 srcv[4][4];
    __m256 idvec[4];

    for (int i = 0; i < nb; i++) {
        for (int row_iter = 0; row_iter < 4; row_iter++) {
            // Load elements into 4 AVX vectors
            __m256 v0 = _mm256_loadu_ps( x + row_iter * k + i * 32 );
            __m256 v1 = _mm256_loadu_ps( x + row_iter * k + i * 32 + 8 );
            __m256 v2 = _mm256_loadu_ps( x + row_iter * k + i * 32 + 16 );
            __m256 v3 = _mm256_loadu_ps( x + row_iter * k + i * 32 + 24 );

            // Compute max(abs(e)) for the block
            const __m256 signBit = _mm256_set1_ps( -0.0f );
            __m256 maxAbs = _mm256_andnot_ps( signBit, v0 );
            maxAbs = _mm256_max_ps( maxAbs, _mm256_andnot_ps( signBit, v1 ) );
            maxAbs = _mm256_max_ps( maxAbs, _mm256_andnot_ps( signBit, v2 ) );
            maxAbs = _mm256_max_ps( maxAbs, _mm256_andnot_ps( signBit, v3 ) );

            __m128 max4 = _mm_max_ps( _mm256_extractf128_ps( maxAbs, 1 ), _mm256_castps256_ps128( maxAbs ) );
            max4 = _mm_max_ps( max4, _mm_movehl_ps( max4, max4 ) );
            max4 = _mm_max_ss( max4, _mm_movehdup_ps( max4 ) );
            const float maxScalar = _mm_cvtss_f32( max4 );

            // Divided by 127.f to mirror results in quantize_row_q8_0
            const float d = maxScalar  / 127.f;
            id[row_iter] = ( maxScalar != 0.0f ) ? 127.f / maxScalar : 0.0f; //d ? 1.0f / d : 0.0f;

            // Store the scale for the individual block
            y[i].d[row_iter] = GGML_FP32_TO_FP16(d);

            // Store the values in blocks of eight values - Aim is to use these later for block interleaving
            srcv[row_iter][0] = v0;
            srcv[row_iter][1] = v1;
            srcv[row_iter][2] = v2;
            srcv[row_iter][3] = v3;
            idvec[row_iter] = _mm256_set1_ps(id[row_iter]);
        }

        // The loop iterates four times - The aim is to get 4 corresponding chunks of eight bytes from the original weight blocks that are interleaved
        for (int j = 0; j < 4; j++) {
            // Apply the multiplier
            __m256 v0 = _mm256_mul_ps(srcv[0][j], idvec[0]);
            __m256 v1 = _mm256_mul_ps(srcv[1][j], idvec[1]);
            __m256 v2 = _mm256_mul_ps(srcv[2][j], idvec[2]);
            __m256 v3 = _mm256_mul_ps(srcv[3][j], idvec[3]);

            // Round to nearest integer
            v0 = _mm256_round_ps( v0, _MM_ROUND_NEAREST );
            v1 = _mm256_round_ps( v1, _MM_ROUND_NEAREST );
            v2 = _mm256_round_ps( v2, _MM_ROUND_NEAREST );
            v3 = _mm256_round_ps( v3, _MM_ROUND_NEAREST );

            // Convert floats to integers
            __m256i i0 = _mm256_cvtps_epi32( v0 );
            __m256i i1 = _mm256_cvtps_epi32( v1 );
            __m256i i2 = _mm256_cvtps_epi32( v2 );
            __m256i i3 = _mm256_cvtps_epi32( v3 );

#if defined(__AVX2__)
            // Convert int32 to int16
            i0 = _mm256_packs_epi32( i0, i1 );
            i2 = _mm256_packs_epi32( i2, i3 );
            // Convert int16 to int8
            i0 = _mm256_packs_epi16( i0, i2 );

            //  Permute and store the quantized weights in the required order after the pack instruction
            const __m256i perm = _mm256_setr_epi32( 0, 4, 1, 5, 2, 6, 3, 7 );
            i0 = _mm256_permutevar8x32_epi32( i0, perm );

            _mm256_storeu_si256((__m256i *)(y[i].qs + 32 * j), i0);
#else
            // Since we don't have in AVX some necessary functions,
            // we split the registers in half and call AVX2 analogs from SSE
            __m128i ni0 = _mm256_castsi256_si128( i0 );
            __m128i ni1 = _mm256_extractf128_si256( i0, 1);
            __m128i ni2 = _mm256_castsi256_si128( i1 );
            __m128i ni3 = _mm256_extractf128_si256( i1, 1);
            __m128i ni4 = _mm256_castsi256_si128( i2 );
            __m128i ni5 = _mm256_extractf128_si256( i2, 1);
            __m128i ni6 = _mm256_castsi256_si128( i3 );
            __m128i ni7 = _mm256_extractf128_si256( i3, 1);

            // Convert int32 to int16
            ni0 = _mm_packs_epi32( ni0, ni1 );
            ni2 = _mm_packs_epi32( ni2, ni3 );
            ni4 = _mm_packs_epi32( ni4, ni5 );
            ni6 = _mm_packs_epi32( ni6, ni7 );
            // Convert int16 to int8
            ni0 = _mm_packs_epi16( ni0, ni2 );
            ni4 = _mm_packs_epi16( ni4, ni6 );
            _mm_storeu_si128((__m128i *)(y[i].qs + 32 * j), ni0);
            _mm_storeu_si128((__m128i *)(y[i].qs + 32 * j + 16), ni4);
#endif
        }
    }
#else
    // scalar
    const int blck_size_interleave = 8;
    float srcv[4][QK8_0];
    float id[4];

    for (int i = 0; i < nb; i++) {
        for (int row_iter = 0; row_iter < 4; row_iter++) {
            float amax = 0.0f; // absolute max

            for (int j = 0; j < QK8_0; j++) {
                srcv[row_iter][j] = x[row_iter * k + i * QK8_0 + j];
                amax = MAX(amax, fabsf(srcv[row_iter][j]));
            }

            const float d = amax / ((1 << 7) - 1);
            id[row_iter] = d ? 1.0f / d : 0.0f;

            y[i].d[row_iter] = GGML_FP32_TO_FP16(d);
        }

        for (int j = 0; j < QK8_0 * 4; j++) {
            int src_offset = (j / (4 * blck_size_interleave)) * blck_size_interleave;
            int src_id = (j % (4 * blck_size_interleave)) / blck_size_interleave;
            src_offset += (j % blck_size_interleave);

            float x0 = srcv[src_id][src_offset] * id[src_id];
            y[i].qs[j] = roundf(x0);
        }
    }
#endif
}